

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::TiledOutputFile::setFrameBuffer(TiledOutputFile *this,FrameBuffer *frameBuffer)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  pointer pTVar2;
  size_t sVar3;
  size_t sVar4;
  undefined3 uVar5;
  int iVar6;
  undefined4 uVar7;
  PixelType PVar8;
  undefined4 uVar9;
  pointer __src;
  int iVar10;
  TOutSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar11;
  ConstIterator CVar12;
  ConstIterator CVar13;
  const_iterator cVar14;
  pointer pTVar15;
  pointer pTVar16;
  ArgExc *pAVar17;
  ostream *poVar18;
  char *pcVar19;
  size_t __n;
  ulong __n_00;
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
  local_1d8;
  undefined1 local_1b8 [16];
  size_t sStack_1a8;
  size_t sStack_1a0;
  bool local_198;
  ulong local_194;
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar10 = pthread_mutex_lock(__mutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = Header::channels(&this->_data->header);
  cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
  do {
    CVar12 = ChannelList::end(this_00);
    if ((const_iterator)cVar11._M_node == CVar12._i._M_node) {
      local_1d8.
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar12 = ChannelList::end(this_00);
        if ((const_iterator)cVar11._M_node == CVar12._i._M_node) break;
        CVar13 = FrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
        cVar14._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
        if (CVar13._i._M_node == (const_iterator)cVar14._M_node) {
          local_1b8._0_4_ = cVar11._M_node[9]._M_color;
          sStack_1a0 = 0;
          local_1b8._8_8_ = (char *)0x0;
          sStack_1a8 = 0;
          local_198 = true;
          local_194 = 0;
          std::
          vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        else {
          local_1b8._0_4_ = *(_Rb_tree_color *)((long)CVar13._i._M_node + 0x120);
          local_1b8._8_8_ = *(undefined8 *)((long)CVar13._i._M_node + 0x128);
          sStack_1a8 = *(size_t *)((long)CVar13._i._M_node + 0x130);
          sStack_1a0 = *(size_t *)((long)CVar13._i._M_node + 0x138);
          local_198 = false;
          local_194 = (ulong)CONCAT14(*(undefined1 *)((long)CVar13._i._M_node + 0x151),
                                      (uint)*(byte *)((long)CVar13._i._M_node + 0x150));
          std::
          vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::operator=((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&this->_data->frameBuffer,
                  (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)frameBuffer);
      pTVar2 = local_1d8.
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __src = local_1d8.
              super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = this->_data;
      __n_00 = (long)local_1d8.
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1d8.
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar15 = (pDVar1->slices).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar1->slices).
                        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar15) < __n_00
         ) {
        pTVar15 = std::
                  _Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                                 *)(((long)__n_00 >> 4) * -0x5555555555555555),(size_t)frameBuffer);
        if (__src != pTVar2) {
          memcpy(pTVar15,__src,((__n_00 - 0x30) / 0x30) * 0x30 + 0x30);
        }
        pTVar2 = (pDVar1->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar2 != (pointer)0x0) {
          operator_delete(pTVar2,(long)(pDVar1->slices).
                                       super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pTVar2);
        }
        (pDVar1->slices).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar15;
        (pDVar1->slices).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar15 + __n_00);
      }
      else {
        pTVar16 = (pDVar1->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pTVar16 - (long)pTVar15;
        if (__n < __n_00) {
          if (pTVar16 != pTVar15) {
            memmove(pTVar15,local_1d8.
                            super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
            pTVar16 = (pDVar1->slices).
                      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __n = (long)pTVar16 -
                  (long)(pDVar1->slices).
                        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          }
          for (pTVar15 = (pointer)((long)&__src->type + __n); pTVar15 != pTVar2;
              pTVar15 = pTVar15 + 1) {
            PVar8 = pTVar15->type;
            uVar9 = *(undefined4 *)&pTVar15->field_0x4;
            pcVar19 = pTVar15->base;
            sVar3 = pTVar15->xStride;
            sVar4 = pTVar15->yStride;
            uVar5 = *(undefined3 *)&pTVar15->field_0x21;
            iVar10 = pTVar15->xTileCoords;
            iVar6 = pTVar15->yTileCoords;
            uVar7 = *(undefined4 *)&pTVar15->field_0x2c;
            pTVar16->zero = pTVar15->zero;
            *(undefined3 *)&pTVar16->field_0x21 = uVar5;
            pTVar16->xTileCoords = iVar10;
            pTVar16->yTileCoords = iVar6;
            *(undefined4 *)&pTVar16->field_0x2c = uVar7;
            pTVar16->xStride = sVar3;
            pTVar16->yStride = sVar4;
            pTVar16->type = PVar8;
            *(undefined4 *)&pTVar16->field_0x4 = uVar9;
            pTVar16->base = pcVar19;
            pTVar16 = pTVar16 + 1;
          }
        }
        else if (local_1d8.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 local_1d8.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pTVar15,local_1d8.
                          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar1->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)(pDVar1->slices).
                           super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start + __n_00);
      if (__src != (pointer)0x0) {
        operator_delete(__src,(long)local_1d8.
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src
                       );
      }
      pthread_mutex_unlock(__mutex);
      return;
    }
    CVar13 = FrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node != (const_iterator)cVar14._M_node) {
      if (cVar11._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar13._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"Pixel type of \"",0xf);
        poVar18 = std::operator<<((ostream *)&sStack_1a8,(char *)(cVar11._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" channel of output file \"",0x1a);
        pcVar19 = OStream::fileName(this->_streamData->os);
        poVar18 = std::operator<<(poVar18,pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar13._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar13._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"All channels in a tiled file must havesampling (1,1).",
                   0x35);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
  } while( true );
}

Assistant:

void
TiledOutputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");

        if (j.slice ().xSampling != 1 || j.slice ().ySampling != 1)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "All channels in a tiled file must have"
                "sampling (1,1).");
    }

    //
    // Initialize slice table for writePixels().
    //

    vector<TOutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (TOutSliceInfo (
                i.channel ().type,
                0,      // base
                0,      // xStride,
                0,      // yStride,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (TOutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().xStride,
                j.slice ().yStride,
                false, // zero
                (j.slice ().xTileCoords) ? 1 : 0,
                (j.slice ().yTileCoords) ? 1 : 0));
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices      = slices;
}